

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O2

int __thiscall application::Chat::run(Chat *this)

{
  wstring *pwVar1;
  wchar_t wVar2;
  uint x;
  char *pcVar3;
  Chat *pCVar4;
  allocator local_79;
  wstring *local_78;
  wstring temp;
  
  temp._M_dataplus._M_p = (pointer)&temp.field_2;
  temp._M_string_length = 0;
  temp.field_2._M_local_buf[0] = L'\0';
  local_78 = (wstring *)&this->prompt_;
  pCVar4 = (Chat *)&std::wcout;
  std::operator<<((wostream *)&std::wcout,local_78);
  pwVar1 = &this->input_;
  while( true ) {
    while( true ) {
      while( true ) {
        do {
          wVar2 = _getwch(pCVar4);
        } while (wVar2 == L'\0');
        if (wVar2 != L'\n') break;
        if ((this->input_)._M_string_length != 0) {
          std::__cxx11::wstring::_M_assign((wstring *)&temp);
          std::mutex::lock(&this->mut);
          cleanInput(this);
          (this->input_)._M_string_length = 0;
          *(this->input_)._M_dataplus._M_p = L'\0';
          std::operator<<((wostream *)&std::wcout,local_78);
          pthread_mutex_unlock((pthread_mutex_t *)&this->mut);
          std::__cxx11::wstring::wstring
                    ((wstring *)&stack0xffffffffffffffb0,temp._M_dataplus._M_p,&local_79);
          sendMessage(this,(wstring *)&stack0xffffffffffffffb0);
          pCVar4 = (Chat *)&stack0xffffffffffffffb0;
          std::__cxx11::wstring::~wstring((wstring *)&stack0xffffffffffffffb0);
        }
      }
      if (wVar2 != L'\x7f') break;
      if ((this->input_)._M_string_length != 0) {
        pCVar4 = (Chat *)pwVar1;
        std::__cxx11::wstring::pop_back();
        x = getConsoleWidth(pCVar4);
        pCVar4 = (Chat *)(ulong)x;
        pcVar3 = "\b \b";
        if ((Chat *)((this->input_)._M_string_length % (ulong)pCVar4 + (long)this->promptLastLine_)
            == pCVar4) {
          moveCursor(pCVar4,x,1);
          pcVar3 = " ";
        }
        pCVar4 = (Chat *)&std::wcout;
        std::operator<<((wostream *)&std::wcout,pcVar3);
      }
    }
    if (wVar2 == L'\x03') break;
    if (((uint)(wVar2 + L'\xffffff5f') < 0xffffffdf && L'\x1f' < wVar2) &&
        (this->input_)._M_string_length < 0x100) {
      std::operator<<((wostream *)&std::wcout,wVar2);
      pCVar4 = (Chat *)pwVar1;
      std::__cxx11::wstring::push_back((wchar_t)pwVar1);
    }
  }
  std::function<void_()>::operator()(&this->beforeExiting_);
  std::__cxx11::wstring::~wstring((wstring *)&temp);
  return 0;
}

Assistant:

int Chat::run()
{
#ifdef _WIN32
	// for 'case Controls::CTR_V':
	HANDLE hData;
#endif
	int k;
	std::wstring temp;
	wchar_t ch;

	std::wcout << prompt_;

	while (true)
	{
		ch = _getwch();

		switch (ch)
		{
		case Controls::NULL_TERMINATOR:
			continue;
			break;
		case Controls::CTR_C:
			beforeExiting_();
			return 0;
#ifdef _WIN32
		case Controls::CTR_V:
			if (!OpenClipboard(nullptr))
			{
				CloseClipboard();
				break;
			}
			hData = GetClipboardData(CF_UNICODETEXT);
			if (hData == nullptr)
			{
				CloseClipboard();
				break;
			}
			temp = static_cast<wchar_t*>(GlobalLock(hData));
			if (temp.empty())
			{
				CloseClipboard();
				break;
			}
			GlobalUnlock(hData);
			CloseClipboard();

			if (temp.size() + input_.size() > MAX_INPUT_SIZE)
				temp = temp.erase(MAX_INPUT_SIZE - input_.size(), temp.size() - MAX_INPUT_SIZE + input_.size());

			k = 0;
			while (temp.find(L"\r\n", k) != std::string::npos)
			{
				sendMessage(temp.substr(k, temp.find(L"\r\n", k) - k));
				k = temp.find(L"\r\n", k) + 2;
			}

			mut.lock();
			cleanInput();
			// If temp added to input_ before cleanInput(), it removes excessive lines
			input_ += temp.substr(k, temp.find(L"/n") - k);
			std::wcout << prompt_ << input_;
			mut.unlock();
			break;
#endif
		case Controls::BACKSPACE:
			if (input_.size() != 0)
			{
				input_.pop_back();
				int w = getConsoleWidth();
				if (promptLastLine_ + input_.size() % w == w)
				{
#ifdef _WIN32
					moveCursor(w - 1, 1);
					std::wcout << " \b";
					moveCursor(w - 1, 1);
#else
					moveCursor(w, 1);
					std::wcout << " ";
#endif
				}
				else
				{
					std::wcout << "\b \b";
				}
			}
			break;
		case Controls::ENTER:
			// Shipped message comes faster than the end of this case
			// cause this I reset data first and then send the message.
			if (input_.size() == 0)
				break;
			temp = input_;

			mut.lock();
			cleanInput();
			input_.clear();
			std::wcout << prompt_;
			mut.unlock();

			sendMessage(temp.c_str());
			break;
		default:
			if (input_.size() < MAX_INPUT_SIZE && ch > 31 && (ch < 128 || ch > 160))
			{
				std::wcout << ch;
				input_.push_back(ch);
			}
			break;
		}
	}
}